

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ShaderCompileStatusCase::test
          (ShaderCompileStatusCase *this)

{
  CallLogWrapper *gl;
  GLuint shader;
  GLuint shader_00;
  
  gl = &(this->super_ApiCase).super_CallLogWrapper;
  requireShaderCompiler
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl);
  shader = glu::CallLogWrapper::glCreateShader(gl,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(gl,0x8b30);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl,
                    shader,0x8b81,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl,
                    shader_00,0x8b81,0);
  glu::CallLogWrapper::glShaderSource
            (gl,shader,1,&(anonymous_namespace)::commonTestVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (gl,shader_00,1,&(anonymous_namespace)::commonTestFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(gl,shader);
  glu::CallLogWrapper::glCompileShader(gl,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl,
                    shader,0x8b81,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl,
                    shader_00,0x8b81,1);
  glu::CallLogWrapper::glDeleteShader(gl,shader);
  glu::CallLogWrapper::glDeleteShader(gl,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		requireShaderCompiler(m_testCtx, *this);

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		verifyShaderParam(m_testCtx, *this, shaderVert, GL_COMPILE_STATUS, GL_FALSE);
		verifyShaderParam(m_testCtx, *this, shaderFrag, GL_COMPILE_STATUS, GL_FALSE);

		glShaderSource(shaderVert, 1, &commonTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &commonTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		verifyShaderParam(m_testCtx, *this, shaderVert, GL_COMPILE_STATUS, GL_TRUE);
		verifyShaderParam(m_testCtx, *this, shaderFrag, GL_COMPILE_STATUS, GL_TRUE);

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		expectError(GL_NO_ERROR);
	}